

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void scale(double *A,int rows,int cols,double alpha)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)(rows * cols);
  if (rows * cols < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    A[uVar1] = A[uVar1] * alpha;
  }
  return;
}

Assistant:

void scale(double *A, int rows, int cols, double alpha) {
	int N,i;
	/*
	 * A = alpha * A
	 * Matrix A is overwritten.
	 */ 
	 
	N = rows * cols;
	
	#pragma omp parallel for
	for (i = 0; i < N;++i) {
		A[i] = alpha * A[i];
	}
}